

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void roaring_bitmap_andnot_inplace(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  uint8_t uVar1;
  ushort x;
  uint uVar2;
  shared_container_t *c;
  undefined8 *c2;
  void **ppvVar3;
  void *pvVar4;
  _Bool _Var5;
  ushort uVar6;
  uint pos;
  container_t *pcVar7;
  byte bVar8;
  ushort *puVar9;
  undefined8 uVar10;
  int iVar11;
  uint uVar12;
  roaring_array_t *ra;
  uint32_t new_begin;
  uint8_t result_type;
  byte local_69;
  ushort *local_68;
  uint local_5c;
  undefined8 local_58;
  uint local_4c;
  roaring_array_t *local_48;
  shared_container_t *local_40;
  uint local_34;
  
  result_type = '\0';
  uVar2 = (x2->high_low_container).size;
  if (uVar2 == 0) {
    return;
  }
  local_4c = (x1->high_low_container).size;
  if (local_4c == 0) {
    ra_reset(&x1->high_low_container);
    return;
  }
  puVar9 = (x1->high_low_container).keys;
  uVar6 = *(x2->high_low_container).keys;
  pos = 0;
  local_5c = 0;
  new_begin = 0;
  local_68 = puVar9;
  local_48 = &x1->high_low_container;
LAB_00106760:
  do {
    x = *puVar9;
    while( true ) {
      if (x == uVar6) break;
      if (x < uVar6) {
        if (local_5c != new_begin) {
          ppvVar3 = local_48->containers;
          uVar1 = local_48->typecodes[local_5c & 0xffff];
          pvVar4 = ppvVar3[local_5c & 0xffff];
          local_68[(int)new_begin] = x;
          ppvVar3[(int)new_begin] = pvVar4;
          local_48->typecodes[(int)new_begin] = uVar1;
        }
        new_begin = new_begin + 1;
        uVar12 = local_5c + 1;
        ra = local_48;
        if (uVar12 == local_4c) goto LAB_00106a39;
        local_68 = local_48->keys;
        puVar9 = local_68 + (uVar12 & 0xffff);
        local_5c = uVar12;
        goto LAB_00106760;
      }
      pos = ra_advance_until(&x2->high_low_container,x,pos);
      uVar12 = local_5c;
      if (pos == uVar2) goto LAB_00106a1a;
      uVar6 = (x2->high_low_container).keys[pos & 0xffff];
    }
    local_69 = local_48->typecodes[local_5c & 0xffff];
    c = (shared_container_t *)local_48->containers[local_5c & 0xffff];
    uVar1 = (x2->high_low_container).typecodes[pos & 0xffff];
    c2 = (undefined8 *)(x2->high_low_container).containers[pos & 0xffff];
    if (local_69 != 4) {
      local_40 = (shared_container_t *)CONCAT71(local_40._1_7_,uVar1);
      local_68 = (ushort *)c2;
      pcVar7 = get_writable_copy_if_shared(c,&local_69);
      puVar9 = local_68;
      bVar8 = (byte)local_40;
      if ((byte)local_40 == 4) {
        puVar9 = (ushort *)*(undefined8 **)local_68;
        bVar8 = *(byte *)((long)local_68 + 8);
      }
      local_58 = 0;
      (*(code *)(&DAT_0011b6d8 +
                *(int *)(&DAT_0011b6d8 + (ulong)(((uint)bVar8 + (uint)local_69 * 4) - 5) * 4)))
                (pcVar7,puVar9);
      return;
    }
    uVar10 = 0;
    local_40 = c;
    local_68 = (ushort *)container_andnot(c,'\x04',c2,uVar1,&result_type);
    shared_container_free(local_40);
    local_40 = (shared_container_t *)
               CONCAT44(local_40._4_4_,(int)CONCAT71((int7)((ulong)uVar10 >> 8),result_type));
    local_34 = (uint)result_type;
    _Var5 = container_nonzero_cardinality(local_68,result_type);
    if (_Var5) {
      local_48->keys[(int)new_begin] = x;
      local_48->containers[(int)new_begin] = local_68;
      local_48->typecodes[(int)new_begin] = (uint8_t)local_40;
      new_begin = new_begin + 1;
    }
    else {
      container_free(local_68,(uint8_t)local_34);
    }
    uVar12 = local_5c + 1;
    if ((uVar12 == local_4c) || (pos = pos + 1, pos == uVar2)) {
LAB_00106a1a:
      ra = local_48;
      iVar11 = local_4c - uVar12;
      if (iVar11 != 0 && (int)uVar12 <= (int)local_4c) {
        if ((int)new_begin < (int)uVar12) {
          ra_copy_range(local_48,uVar12,local_4c,new_begin);
        }
        new_begin = new_begin + iVar11;
      }
LAB_00106a39:
      ra_downsize(ra,new_begin);
      return;
    }
    local_68 = local_48->keys;
    puVar9 = local_68 + (uVar12 & 0xffff);
    uVar6 = (x2->high_low_container).keys[pos & 0xffff];
    local_5c = uVar12;
  } while( true );
}

Assistant:

void roaring_bitmap_andnot_inplace(roaring_bitmap_t *x1,
                                   const roaring_bitmap_t *x2) {
    assert(x1 != x2);

    uint8_t result_type = 0;
    int length1 = x1->high_low_container.size;
    const int length2 = x2->high_low_container.size;
    int intersection_size = 0;

    if (0 == length2) return;

    if (0 == length1) {
        roaring_bitmap_clear(x1);
        return;
    }

    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);

            // We do the computation "in place" only when c1 is not a shared
            // container. Rationale: using a shared container safely with in
            // place computation would require making a copy and then doing the
            // computation in place which is likely less efficient than avoiding
            // in place entirely and always generating a new container.

            container_t *c;
            if (type1 == SHARED_CONTAINER_TYPE) {
                c = container_andnot(c1, type1, c2, type2, &result_type);
                shared_container_free(CAST_shared(c1));  // release
            } else {
                c = container_iandnot(c1, type1, c2, type2, &result_type);
            }

            if (container_nonzero_cardinality(c, result_type)) {
                ra_replace_key_and_container_at_index(&x1->high_low_container,
                                                      intersection_size++, s1,
                                                      c, result_type);
            } else {
                container_free(c, result_type);
            }

            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        } else if (s1 < s2) {  // s1 < s2
            if (pos1 != intersection_size) {
                container_t *c1 = ra_get_container_at_index(
                    &x1->high_low_container, (uint16_t)pos1, &type1);

                ra_replace_key_and_container_at_index(
                    &x1->high_low_container, intersection_size, s1, c1, type1);
            }
            intersection_size++;
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);

        } else {  // s1 > s2
            pos2 = ra_advance_until(&x2->high_low_container, s1, pos2);
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
        }
    }

    if (pos1 < length1) {
        // all containers between intersection_size and
        // pos1 are junk.  However, they have either been moved
        // (thus still referenced) or involved in an iandnot
        // that will clean up all containers that could not be reused.
        // Thus we should not free the junk containers between
        // intersection_size and pos1.
        if (pos1 > intersection_size) {
            // left slide of remaining items
            ra_copy_range(&x1->high_low_container, pos1, length1,
                          intersection_size);
        }
        // else current placement is fine
        intersection_size += (length1 - pos1);
    }
    ra_downsize(&x1->high_low_container, intersection_size);
}